

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O3

void __thiscall
Imf_3_4::IDManifest::ChannelGroupManifest::setComponents
          (ChannelGroupManifest *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *components)

{
  ArgExc *this_00;
  stringstream _iex_throw_s;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if (((this->_table)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     ((long)(components->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(components->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start !=
      (long)(this->_components).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_components).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(asStack_198);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_188,
               "attempt to change number of components in manifest once entries have been added",
               0x4f);
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,asStack_198);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->_components,components);
  return;
}

Assistant:

void
IDManifest::ChannelGroupManifest::setComponents (
    const std::vector<std::string>& components)
{

    // if there are already entries in the table, cannot change the number of components
    if (_table.size () != 0 && components.size () != _components.size ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "attempt to change number of components in manifest once entries have been added");
    }
    _components = components;
}